

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-lexer.cpp
# Opt level: O1

void __thiscall LexerTest_LexHexFloat_Test::TestBody(LexerTest_LexHexFloat_Test *this)

{
  byte bVar1;
  ulong uVar2;
  char *pcVar3;
  char *in_R9;
  pointer *__ptr;
  _Storage<double,_true> extraout_XMM0_Qa;
  _Storage<double,_true> extraout_XMM0_Qa_00;
  _Storage<double,_true> extraout_XMM0_Qa_01;
  _Storage<double,_true> extraout_XMM0_Qa_02;
  _Storage<double,_true> extraout_XMM0_Qa_03;
  _Storage<double,_true> extraout_XMM0_Qa_04;
  _Storage<double,_true> extraout_XMM0_Qa_05;
  _Storage<double,_true> extraout_XMM0_Qa_06;
  _Storage<double,_true> extraout_XMM0_Qa_07;
  _Storage<double,_true> extraout_XMM0_Qa_08;
  _Storage<double,_true> extraout_XMM0_Qa_09;
  _Storage<double,_true> extraout_XMM0_Qa_10;
  _Storage<double,_true> extraout_XMM0_Qa_11;
  _Storage<double,_true> extraout_XMM0_Qa_12;
  _Storage<double,_true> extraout_XMM0_Qa_13;
  string_view buffer;
  string_view buffer_00;
  string_view buffer_01;
  string_view buffer_02;
  string_view buffer_03;
  string_view buffer_04;
  string_view buffer_05;
  string_view buffer_06;
  string_view buffer_07;
  string_view buffer_08;
  string_view buffer_09;
  string_view buffer_10;
  string_view buffer_11;
  string_view buffer_12;
  string_view buffer_13;
  string_view buffer_14;
  string_view buffer_15;
  string_view buffer_16;
  string_view buffer_17;
  string_view buffer_18;
  string_view buffer_19;
  string_view buffer_20;
  string_view buffer_21;
  string_view buffer_22;
  string_view buffer_23;
  string_view buffer_24;
  string_view buffer_25;
  string_view buffer_26;
  string_view buffer_27;
  string_view buffer_28;
  string_view buffer_29;
  string_view buffer_30;
  string_view buffer_31;
  string_view buffer_32;
  string_view buffer_33;
  string_view buffer_34;
  string_view buffer_35;
  string_view buffer_36;
  string_view buffer_37;
  string_view buffer_38;
  string_view buffer_39;
  string_view buffer_40;
  string_view buffer_41;
  string_view buffer_42;
  string_view buffer_43;
  string_view buffer_44;
  string_view buffer_45;
  string_view buffer_46;
  string_view buffer_47;
  string_view buffer_48;
  string_view buffer_49;
  string_view buffer_50;
  string_view buffer_51;
  string_view buffer_52;
  string_view buffer_53;
  string_view buffer_54;
  string_view buffer_55;
  string_view buffer_56;
  string_view buffer_57;
  string_view buffer_58;
  string_view buffer_59;
  string_view buffer_60;
  string_view buffer_61;
  string_view buffer_62;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_aa8;
  bool local_a88;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a80;
  bool local_a60;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a58;
  bool local_a38;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a30;
  bool local_a10;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_a08;
  bool local_9e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_9e0;
  bool local_9c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_9b8;
  bool local_998;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_990;
  bool local_970;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_968;
  bool local_948;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_940;
  bool local_920;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_918;
  bool local_8f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_8f0;
  bool local_8d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_8c8;
  bool local_8a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_8a0;
  bool local_880;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_878;
  bool local_858;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_850;
  bool local_830;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_828;
  bool local_808;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_800;
  bool local_7e0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_7d8;
  bool local_7b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_7b0;
  bool local_790;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_788;
  bool local_768;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_760;
  bool local_740;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_738;
  bool local_718;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_710;
  bool local_6f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_6e8;
  bool local_6c8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_6c0;
  bool local_6a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_698;
  bool local_678;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_670;
  bool local_650;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_648;
  bool local_628;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_620;
  bool local_600;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5f8;
  bool local_5d8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5d0;
  bool local_5b0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_5a8;
  bool local_588;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_580;
  bool local_560;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_558;
  bool local_538;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_530;
  bool local_510;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_508;
  bool local_4e8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4e0;
  bool local_4c0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_4b8;
  bool local_498;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_490;
  bool local_470;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_468;
  bool local_448;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_440;
  bool local_420;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_418;
  bool local_3f8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3f0;
  bool local_3d0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3c8;
  bool local_3a8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_3a0;
  bool local_380;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_378;
  bool local_358;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_350;
  bool local_330;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_328;
  bool local_308;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_300;
  bool local_2e0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2d8;
  bool local_2b8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_2b0;
  bool local_290;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_288;
  bool local_268;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_260;
  bool local_240;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_238;
  bool local_218;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_210;
  bool local_1f0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1e8;
  bool local_1c8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1c0;
  bool local_1a0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_198;
  bool local_178;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_170;
  bool local_150;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_148;
  bool local_128;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_120;
  bool local_100;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_f8;
  bool local_d8;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_d0;
  bool local_b0;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_88;
  bool local_68;
  _Storage<double,_true> local_50;
  undefined1 local_48;
  AssertHelper local_40;
  internal local_38 [8];
  AssertionResult gtest_ar;
  
  local_a88 = false;
  buffer._M_str = "0x4B";
  buffer._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_aa8);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x42960000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4B\"sv).takeF32()","0x4Bp0f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_a88 == true) {
    local_a88 = false;
    if (local_aa8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_aa8._M_value + 0x10)) {
      operator_delete((void *)local_aa8._M_value._M_dataplus._M_p,local_aa8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x245,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_a60 = false;
  buffer_00._M_str = "0x4B";
  buffer_00._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_00,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a80);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4052c00000000000;
  local_50 = extraout_XMM0_Qa;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4B\"sv).takeF64()","0x4Bp0",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_a60 == true) {
    local_a60 = false;
    if (local_a80._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a80._M_value + 0x10)) {
      operator_delete((void *)local_a80._M_value._M_dataplus._M_p,local_a80._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x246,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_a38 = false;
  buffer_01._M_str = "0x4B.";
  buffer_01._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_01,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a58);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x42960000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4B.\"sv).takeF32()","0x4B.p0f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_a38 == true) {
    local_a38 = false;
    if (local_a58._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a58._M_value + 0x10)) {
      operator_delete((void *)local_a58._M_value._M_dataplus._M_p,local_a58._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x248,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_a10 = false;
  buffer_02._M_str = "0x4B.";
  buffer_02._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_02,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a30);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4052c00000000000;
  local_50 = extraout_XMM0_Qa_00;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4B.\"sv).takeF64()","0x4B.p0",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_a10 == true) {
    local_a10 = false;
    if (local_a30._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a30._M_value + 0x10)) {
      operator_delete((void *)local_a30._M_value._M_dataplus._M_p,local_a30._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x249,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_9e8 = false;
  buffer_03._M_str = "0x4B.5";
  buffer_03._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_03,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_a08);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x4296a000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4B.5\"sv).takeF32()","0x4B.5p0f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_9e8 == true) {
    local_9e8 = false;
    if (local_a08._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_a08._M_value + 0x10)) {
      operator_delete((void *)local_a08._M_value._M_dataplus._M_p,local_a08._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x24b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_9c0 = false;
  buffer_04._M_str = "0x4B.5";
  buffer_04._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_04,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_9e0);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4052d40000000000;
  local_50 = extraout_XMM0_Qa_01;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4B.5\"sv).takeF64()","0x4B.5p0",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_9c0 == true) {
    local_9c0 = false;
    if (local_9e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_9e0._M_value + 0x10)) {
      operator_delete((void *)local_9e0._M_value._M_dataplus._M_p,local_9e0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x24c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_998 = false;
  buffer_05._M_str = "0x4Bp0";
  buffer_05._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_05,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_9b8);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x42960000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4Bp0\"sv).takeF32()","0x4Bp0f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_998 == true) {
    local_998 = false;
    if (local_9b8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_9b8._M_value + 0x10)) {
      operator_delete((void *)local_9b8._M_value._M_dataplus._M_p,local_9b8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x24e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_970 = false;
  buffer_06._M_str = "0x4Bp0";
  buffer_06._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_06,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_990);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4052c00000000000;
  local_50 = extraout_XMM0_Qa_02;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4Bp0\"sv).takeF64()","0x4Bp0",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_970 == true) {
    local_970 = false;
    if (local_990._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_990._M_value + 0x10)) {
      operator_delete((void *)local_990._M_value._M_dataplus._M_p,local_990._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x24f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_948 = false;
  buffer_07._M_str = "0x4B.p1";
  buffer_07._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_07,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_968);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x43160000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4B.p1\"sv).takeF32()","0x4B.p1f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_948 == true) {
    local_948 = false;
    if (local_968._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_968._M_value + 0x10)) {
      operator_delete((void *)local_968._M_value._M_dataplus._M_p,local_968._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x251,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_920 = false;
  buffer_08._M_str = "0x4B.p1";
  buffer_08._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_08,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_940);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4062c00000000000;
  local_50 = extraout_XMM0_Qa_03;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4B.p1\"sv).takeF64()","0x4B.p1",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_920 == true) {
    local_920 = false;
    if (local_940._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_940._M_value + 0x10)) {
      operator_delete((void *)local_940._M_value._M_dataplus._M_p,local_940._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x252,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_8f8 = false;
  buffer_09._M_str = "0x4BP1";
  buffer_09._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_09,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_918);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x43160000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4BP1\"sv).takeF32()","0x4BP1f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_8f8 == true) {
    local_8f8 = false;
    if (local_918._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_918._M_value + 0x10)) {
      operator_delete((void *)local_918._M_value._M_dataplus._M_p,local_918._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x254,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_8d0 = false;
  buffer_10._M_str = "0x4BP1";
  buffer_10._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_10,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_8f0);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4062c00000000000;
  local_50 = extraout_XMM0_Qa_04;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4BP1\"sv).takeF64()","0x4BP1",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_8d0 == true) {
    local_8d0 = false;
    if (local_8f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_8f0._M_value + 0x10)) {
      operator_delete((void *)local_8f0._M_value._M_dataplus._M_p,local_8f0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x255,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_8a8 = false;
  buffer_11._M_str = "0x4Bp+2";
  buffer_11._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_11,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_8c8);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x43960000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4Bp+2\"sv).takeF32()","0x4Bp+2f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_8a8 == true) {
    local_8a8 = false;
    if (local_8c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_8c8._M_value + 0x10)) {
      operator_delete((void *)local_8c8._M_value._M_dataplus._M_p,local_8c8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,599,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_880 = false;
  buffer_12._M_str = "0x4Bp+2";
  buffer_12._M_len = 7;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_12,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_8a0);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4072c00000000000;
  local_50 = extraout_XMM0_Qa_05;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4Bp+2\"sv).takeF64()","0x4Bp+2",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_880 == true) {
    local_880 = false;
    if (local_8a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_8a0._M_value + 0x10)) {
      operator_delete((void *)local_8a0._M_value._M_dataplus._M_p,local_8a0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,600,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_858 = false;
  buffer_13._M_str = "0x4B.P-02";
  buffer_13._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_13,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_878);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x41960000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4B.P-02\"sv).takeF32()","0x4B.P-02f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_858 == true) {
    local_858 = false;
    if (local_878._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_878._M_value + 0x10)) {
      operator_delete((void *)local_878._M_value._M_dataplus._M_p,local_878._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x25a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_830 = false;
  buffer_14._M_str = "0x4B.P-02";
  buffer_14._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_14,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_850);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4032c00000000000;
  local_50 = extraout_XMM0_Qa_06;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4B.P-02\"sv).takeF64()","0x4B.P-02",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_830 == true) {
    local_830 = false;
    if (local_850._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_850._M_value + 0x10)) {
      operator_delete((void *)local_850._M_value._M_dataplus._M_p,local_850._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x25b,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_808 = false;
  buffer_15._M_str = "0x4B.0p0";
  buffer_15._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_15,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_828);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x42960000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4B.0p0\"sv).takeF32()","0x4B.0p0f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_808 == true) {
    local_808 = false;
    if (local_828._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_828._M_value + 0x10)) {
      operator_delete((void *)local_828._M_value._M_dataplus._M_p,local_828._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x25d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_7e0 = false;
  buffer_16._M_str = "0x4B.0p0";
  buffer_16._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_16,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_800);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4052c00000000000;
  local_50 = extraout_XMM0_Qa_07;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4B.0p0\"sv).takeF64()","0x4B.0p0",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_7e0 == true) {
    local_7e0 = false;
    if (local_800._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_800._M_value + 0x10)) {
      operator_delete((void *)local_800._M_value._M_dataplus._M_p,local_800._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x25e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_7b8 = false;
  buffer_17._M_str = "0x4B.0P1";
  buffer_17._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_17,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_7d8);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x43160000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4B.0P1\"sv).takeF32()","0x4B.0P1f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_7b8 == true) {
    local_7b8 = false;
    if (local_7d8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_7d8._M_value + 0x10)) {
      operator_delete((void *)local_7d8._M_value._M_dataplus._M_p,local_7d8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x260,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_790 = false;
  buffer_18._M_str = "0x4B.0P1";
  buffer_18._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_18,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_7b0);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4062c00000000000;
  local_50 = extraout_XMM0_Qa_08;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4B.0P1\"sv).takeF64()","0x4B.0P1",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_790 == true) {
    local_790 = false;
    if (local_7b0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_7b0._M_value + 0x10)) {
      operator_delete((void *)local_7b0._M_value._M_dataplus._M_p,local_7b0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x261,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_768 = false;
  buffer_19._M_str = "0x4B.0p+2";
  buffer_19._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_19,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_788);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x43960000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4B.0p+2\"sv).takeF32()","0x4B.0p+2f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_768 == true) {
    local_768 = false;
    if (local_788._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_788._M_value + 0x10)) {
      operator_delete((void *)local_788._M_value._M_dataplus._M_p,local_788._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x263,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_740 = false;
  buffer_20._M_str = "0x4B.0p+2";
  buffer_20._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_20,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_760);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4072c00000000000;
  local_50 = extraout_XMM0_Qa_09;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4B.0p+2\"sv).takeF64()","0x4B.0p+2",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_740 == true) {
    local_740 = false;
    if (local_760._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_760._M_value + 0x10)) {
      operator_delete((void *)local_760._M_value._M_dataplus._M_p,local_760._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x264,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_718 = false;
  buffer_21._M_str = "0x4B.0P-2";
  buffer_21._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_21,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_738);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x41960000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4B.0P-2\"sv).takeF32()","0x4B.0P-2f",(optional<float> *)&local_50,
             (float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_718 == true) {
    local_718 = false;
    if (local_738._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_738._M_value + 0x10)) {
      operator_delete((void *)local_738._M_value._M_dataplus._M_p,local_738._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x266,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_6f0 = false;
  buffer_22._M_str = "0x4B.0P-2";
  buffer_22._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_22,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_710);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4032c00000000000;
  local_50 = extraout_XMM0_Qa_10;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4B.0P-2\"sv).takeF64()","0x4B.0P-2",(optional<double> *)&local_50,
             (double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_6f0 == true) {
    local_6f0 = false;
    if (local_710._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_710._M_value + 0x10)) {
      operator_delete((void *)local_710._M_value._M_dataplus._M_p,local_710._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x267,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_6c8 = false;
  buffer_23._M_str = "+0x4B.0p+2";
  buffer_23._M_len = 10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_23,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_6e8);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x43960000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"+0x4B.0p+2\"sv).takeF32()","+0x4B.0p+2f",(optional<float> *)&local_50
             ,(float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_6c8 == true) {
    local_6c8 = false;
    if (local_6e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_6e8._M_value + 0x10)) {
      operator_delete((void *)local_6e8._M_value._M_dataplus._M_p,local_6e8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x269,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_6a0 = false;
  buffer_24._M_str = "+0x4B.0p+2";
  buffer_24._M_len = 10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_24,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_6c0);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4072c00000000000;
  local_50 = extraout_XMM0_Qa_11;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"+0x4B.0p+2\"sv).takeF64()","+0x4B.0p+2",(optional<double> *)&local_50
             ,(double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_6a0 == true) {
    local_6a0 = false;
    if (local_6c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_6c0._M_value + 0x10)) {
      operator_delete((void *)local_6c0._M_value._M_dataplus._M_p,local_6c0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x26a,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_678 = false;
  buffer_25._M_str = "-0x4B.0p+2";
  buffer_25._M_len = 10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_25,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_698);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0xc3960000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"-0x4B.0p+2\"sv).takeF32()","-0x4B.0p+2f",(optional<float> *)&local_50
             ,(float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_678 == true) {
    local_678 = false;
    if (local_698._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_698._M_value + 0x10)) {
      operator_delete((void *)local_698._M_value._M_dataplus._M_p,local_698._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x26c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )local_a8._0_8_ !=
        (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_650 = false;
  buffer_26._M_str = "-0x4B.0p+2";
  buffer_26._M_len = 10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_26,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_670);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0xc072c00000000000;
  local_50 = extraout_XMM0_Qa_12;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"-0x4B.0p+2\"sv).takeF64()","-0x4B.0p+2",(optional<double> *)&local_50
             ,(double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_650 == true) {
    local_650 = false;
    if (local_670._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_670._M_value + 0x10)) {
      operator_delete((void *)local_670._M_value._M_dataplus._M_p,local_670._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x26d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_628 = false;
  buffer_27._M_str = "0x4_2.0_0p+0_2";
  buffer_27._M_len = 0xe;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_27,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_648);
  local_50._M_value = (double)::wasm::WATParser::Lexer::takeF32();
  local_40.data_._0_4_ = 0x43840000;
  testing::internal::CmpHelperEQ<std::optional<float>,float>
            (local_38,"Lexer(\"0x4_2.0_0p+0_2\"sv).takeF32()","0x42.00p+02f",
             (optional<float> *)&local_50,(float *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_628 == true) {
    local_628 = false;
    if (local_648._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_648._M_value + 0x10)) {
      operator_delete((void *)local_648._M_value._M_dataplus._M_p,local_648._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x26f,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )local_a8._0_8_ !=
        (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_600 = false;
  buffer_28._M_str = "0x4_2.0_0p+0_2";
  buffer_28._M_len = 0xe;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_28,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_620);
  local_48 = ::wasm::WATParser::Lexer::takeF64();
  local_40.data_ = (AssertHelperData *)0x4070800000000000;
  local_50 = extraout_XMM0_Qa_13;
  testing::internal::CmpHelperEQ<std::optional<double>,double>
            (local_38,"Lexer(\"0x4_2.0_0p+0_2\"sv).takeF64()","0x42.00p+02",
             (optional<double> *)&local_50,(double *)&local_40);
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_600 == true) {
    local_600 = false;
    if (local_620._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_620._M_value + 0x10)) {
      operator_delete((void *)local_620._M_value._M_dataplus._M_p,local_620._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (gtest_ar._0_8_ == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)gtest_ar._0_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x270,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_50,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_50);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_5d8 = false;
  buffer_29._M_str = "0x4Bjunk";
  buffer_29._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_29,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_5f8);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 >> 0x20 & 1) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_5d8 == true) {
    local_5d8 = false;
    if (local_5f8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_5f8._M_value + 0x10)) {
      operator_delete((void *)local_5f8._M_value._M_dataplus._M_p,local_5f8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4Bjunk\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x272,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_5b0 = false;
  buffer_30._M_str = "0x4Bjunk";
  buffer_30._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_30,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_5d0);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_5b0 == true) {
    local_5b0 = false;
    if (local_5d0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_5d0._M_value + 0x10)) {
      operator_delete((void *)local_5d0._M_value._M_dataplus._M_p,local_5d0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4Bjunk\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x273,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_588 = false;
  buffer_31._M_str = "0x4B.junk";
  buffer_31._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_31,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_5a8);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_588 == true) {
    local_588 = false;
    if (local_5a8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_5a8._M_value + 0x10)) {
      operator_delete((void *)local_5a8._M_value._M_dataplus._M_p,local_5a8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.junk\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x275,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_560 = false;
  buffer_32._M_str = "0x4B.junk";
  buffer_32._M_len = 9;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_32,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_580);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_560 == true) {
    local_560 = false;
    if (local_580._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_580._M_value + 0x10)) {
      operator_delete((void *)local_580._M_value._M_dataplus._M_p,local_580._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.junk\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x276,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_538 = false;
  buffer_33._M_str = "0x4B.0junk";
  buffer_33._M_len = 10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_33,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_558);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_538 == true) {
    local_538 = false;
    if (local_558._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_558._M_value + 0x10)) {
      operator_delete((void *)local_558._M_value._M_dataplus._M_p,local_558._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.0junk\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x278,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_510 = false;
  buffer_34._M_str = "0x4B.0junk";
  buffer_34._M_len = 10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_34,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_530);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_510 == true) {
    local_510 = false;
    if (local_530._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_530._M_value + 0x10)) {
      operator_delete((void *)local_530._M_value._M_dataplus._M_p,local_530._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.0junk\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x279,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_4e8 = false;
  buffer_35._M_str = "0x4B.Pjunk";
  buffer_35._M_len = 10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_35,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_508);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_4e8 == true) {
    local_4e8 = false;
    if (local_508._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_508._M_value + 0x10)) {
      operator_delete((void *)local_508._M_value._M_dataplus._M_p,local_508._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.Pjunk\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x27b,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_4c0 = false;
  buffer_36._M_str = "0x4B.Pjunk";
  buffer_36._M_len = 10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_36,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4e0);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_4c0 == true) {
    local_4c0 = false;
    if (local_4e0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_4e0._M_value + 0x10)) {
      operator_delete((void *)local_4e0._M_value._M_dataplus._M_p,local_4e0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.Pjunk\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x27c,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_498 = false;
  buffer_37._M_str = "0x4B.p-junk";
  buffer_37._M_len = 0xb;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_37,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_4b8);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_498 == true) {
    local_498 = false;
    if (local_4b8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_4b8._M_value + 0x10)) {
      operator_delete((void *)local_4b8._M_value._M_dataplus._M_p,local_4b8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.p-junk\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x27e,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_470 = false;
  buffer_38._M_str = "0x4B.p-junk";
  buffer_38._M_len = 0xb;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_38,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_490);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_470 == true) {
    local_470 = false;
    if (local_490._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_490._M_value + 0x10)) {
      operator_delete((void *)local_490._M_value._M_dataplus._M_p,local_490._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.p-junk\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x27f,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_448 = false;
  buffer_39._M_str = "0x4B.p-10junk";
  buffer_39._M_len = 0xd;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_39,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_468);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_448 == true) {
    local_448 = false;
    if (local_468._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_468._M_value + 0x10)) {
      operator_delete((void *)local_468._M_value._M_dataplus._M_p,local_468._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.p-10junk\"sv).takeF32()"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x281,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_420 = false;
  buffer_40._M_str = "0x4B.p-10junk";
  buffer_40._M_len = 0xd;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_40,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_440);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_420 == true) {
    local_420 = false;
    if (local_440._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_440._M_value + 0x10)) {
      operator_delete((void *)local_440._M_value._M_dataplus._M_p,local_440._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.p-10junk\"sv).takeF64()"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x282,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_3f8 = false;
  buffer_41._M_str = "+0x";
  buffer_41._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_41,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_418);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_3f8 == true) {
    local_3f8 = false;
    if (local_418._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_418._M_value + 0x10)) {
      operator_delete((void *)local_418._M_value._M_dataplus._M_p,local_418._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"+0x\"sv).takeF32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x284,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_3d0 = false;
  buffer_42._M_str = "+0x";
  buffer_42._M_len = 3;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_42,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_3f0);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_3d0 == true) {
    local_3d0 = false;
    if (local_3f0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3f0._M_value + 0x10)) {
      operator_delete((void *)local_3f0._M_value._M_dataplus._M_p,local_3f0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"+0x\"sv).takeF64()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x285,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_3a8 = false;
  buffer_43._M_str = "0x4Bp";
  buffer_43._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_43,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_3c8);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_3a8 == true) {
    local_3a8 = false;
    if (local_3c8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3c8._M_value + 0x10)) {
      operator_delete((void *)local_3c8._M_value._M_dataplus._M_p,local_3c8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4Bp\"sv).takeF32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x287,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_380 = false;
  buffer_44._M_str = "0x4Bp";
  buffer_44._M_len = 5;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_44,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_3a0);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_380 == true) {
    local_380 = false;
    if (local_3a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_3a0._M_value + 0x10)) {
      operator_delete((void *)local_3a0._M_value._M_dataplus._M_p,local_3a0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4Bp\"sv).takeF64()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x288,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_358 = false;
  buffer_45._M_str = "0x4BpABC";
  buffer_45._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_45,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_378);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_358 == true) {
    local_358 = false;
    if (local_378._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_378._M_value + 0x10)) {
      operator_delete((void *)local_378._M_value._M_dataplus._M_p,local_378._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4BpABC\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x28a,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_330 = false;
  buffer_46._M_str = "0x4BpABC";
  buffer_46._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_46,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_350);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_330 == true) {
    local_330 = false;
    if (local_350._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_350._M_value + 0x10)) {
      operator_delete((void *)local_350._M_value._M_dataplus._M_p,local_350._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4BpABC\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x28b,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_308 = false;
  buffer_47._M_str = "0x4Bp0xABC";
  buffer_47._M_len = 10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_47,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_328);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_308 == true) {
    local_308 = false;
    if (local_328._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_328._M_value + 0x10)) {
      operator_delete((void *)local_328._M_value._M_dataplus._M_p,local_328._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4Bp0xABC\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x28d,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_2e0 = false;
  buffer_48._M_str = "0x4Bp0xABC";
  buffer_48._M_len = 10;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_48,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_300);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_2e0 == true) {
    local_2e0 = false;
    if (local_300._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_300._M_value + 0x10)) {
      operator_delete((void *)local_300._M_value._M_dataplus._M_p,local_300._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4Bp0xABC\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x28e,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_2b8 = false;
  buffer_49._M_str = "0x+0";
  buffer_49._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_49,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2d8);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_2b8 == true) {
    local_2b8 = false;
    if (local_2d8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2d8._M_value + 0x10)) {
      operator_delete((void *)local_2d8._M_value._M_dataplus._M_p,local_2d8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x+0\"sv).takeF32()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x290,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_290 = false;
  buffer_50._M_str = "0x+0";
  buffer_50._M_len = 4;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_50,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_2b0);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_290 == true) {
    local_290 = false;
    if (local_2b0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_2b0._M_value + 0x10)) {
      operator_delete((void *)local_2b0._M_value._M_dataplus._M_p,local_2b0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x+0\"sv).takeF64()","true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x291,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_268 = false;
  buffer_51._M_str = "+-0x4B";
  buffer_51._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_51,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_288);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_268 == true) {
    local_268 = false;
    if (local_288._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_288._M_value + 0x10)) {
      operator_delete((void *)local_288._M_value._M_dataplus._M_p,local_288._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"+-0x4B\"sv).takeF32()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x293,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_240 = false;
  buffer_52._M_str = "+-0x4B";
  buffer_52._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_52,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_260);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_240 == true) {
    local_240 = false;
    if (local_260._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_260._M_value + 0x10)) {
      operator_delete((void *)local_260._M_value._M_dataplus._M_p,local_260._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"+-0x4B\"sv).takeF64()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x294,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_218 = false;
  buffer_53._M_str = "-+0x4B";
  buffer_53._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_53,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_238);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_218 == true) {
    local_218 = false;
    if (local_238._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_238._M_value + 0x10)) {
      operator_delete((void *)local_238._M_value._M_dataplus._M_p,local_238._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"-+0x4B\"sv).takeF32()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x296,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_1f0 = false;
  buffer_54._M_str = "-+0x4B";
  buffer_54._M_len = 6;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_54,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_210);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_1f0 == true) {
    local_1f0 = false;
    if (local_210._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_210._M_value + 0x10)) {
      operator_delete((void *)local_210._M_value._M_dataplus._M_p,local_210._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"-+0x4B\"sv).takeF64()","true"
               ,"false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x297,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_1c8 = false;
  buffer_55._M_str = "0x4Bp+-0";
  buffer_55._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_55,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1e8);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_1c8 == true) {
    local_1c8 = false;
    if (local_1e8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1e8._M_value + 0x10)) {
      operator_delete((void *)local_1e8._M_value._M_dataplus._M_p,local_1e8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4Bp+-0\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x299,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_1a0 = false;
  buffer_56._M_str = "0x4Bp+-0";
  buffer_56._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_56,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_1c0);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_1a0 == true) {
    local_1a0 = false;
    if (local_1c0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1c0._M_value + 0x10)) {
      operator_delete((void *)local_1c0._M_value._M_dataplus._M_p,local_1c0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4Bp+-0\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x29a,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_178 = false;
  buffer_57._M_str = "0x4Bp-+0";
  buffer_57._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_57,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_198);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_178 == true) {
    local_178 = false;
    if (local_198._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_198._M_value + 0x10)) {
      operator_delete((void *)local_198._M_value._M_dataplus._M_p,local_198._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4Bp-+0\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x29c,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_150 = false;
  buffer_58._M_str = "0x4Bp-+0";
  buffer_58._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_58,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_170);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_150 == true) {
    local_150 = false;
    if (local_170._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_170._M_value + 0x10)) {
      operator_delete((void *)local_170._M_value._M_dataplus._M_p,local_170._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4Bp-+0\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x29d,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_128 = false;
  buffer_59._M_str = "0x4B.e+0";
  buffer_59._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_59,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_148);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_128 == true) {
    local_128 = false;
    if (local_148._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_148._M_value + 0x10)) {
      operator_delete((void *)local_148._M_value._M_dataplus._M_p,local_148._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.e+0\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x29f,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_100 = false;
  buffer_60._M_str = "0x4B.e+0";
  buffer_60._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_60,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_120);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_100 == true) {
    local_100 = false;
    if (local_120._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_120._M_value + 0x10)) {
      operator_delete((void *)local_120._M_value._M_dataplus._M_p,local_120._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.e+0\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2a0,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_d8 = false;
  buffer_61._M_str = "0x4B.E-0";
  buffer_61._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_61,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_f8);
  uVar2 = ::wasm::WATParser::Lexer::takeF32();
  local_38[0] = (internal)((uVar2 & 0x100000000) == 0);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_d8 == true) {
    local_d8 = false;
    if (local_f8._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_f8._M_value + 0x10)) {
      operator_delete((void *)local_f8._M_value._M_dataplus._M_p,local_f8._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.E-0\"sv).takeF32()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2a2,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8._0_8_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_a8 + 0x10)
       ) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  local_b0 = false;
  buffer_62._M_str = "0x4B.E-0";
  buffer_62._M_len = 8;
  ::wasm::WATParser::Lexer::Lexer
            ((Lexer *)local_a8,buffer_62,
             (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_d0);
  bVar1 = ::wasm::WATParser::Lexer::takeF64();
  local_38[0] = (internal)(~bVar1 & 1);
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  if (local_68 == true) {
    local_68 = false;
    if (local_88._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_88._M_value + 0x10)) {
      operator_delete((void *)local_88._M_value._M_dataplus._M_p,local_88._16_8_ + 1);
    }
  }
  if ((pointer)local_a8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._8_8_,local_98._8_8_ - local_a8._8_8_);
  }
  if (local_b0 == true) {
    local_b0 = false;
    if (local_d0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_d0._M_value + 0x10)) {
      operator_delete((void *)local_d0._M_value._M_dataplus._M_p,local_d0._16_8_ + 1);
    }
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a8,local_38,(AssertionResult *)"Lexer(\"0x4B.E-0\"sv).takeF64()",
               "true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/wat-lexer.cpp"
               ,0x2a3,(char *)local_a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_a8._0_8_ != (long)local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,(ulong)(local_98._M_allocated_capacity + 1));
    }
    if (local_50 != (_Storage<double,_true>)0x0) {
      (**(code **)(*(long *)local_50 + 8))();
    }
  }
  if (gtest_ar._0_8_ != 0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&gtest_ar,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_ar._0_8_
                );
  }
  return;
}

Assistant:

TEST(LexerTest, LexHexFloat) {

  EXPECT_EQ(Lexer("0x4B"sv).takeF32(), 0x4Bp0f);
  EXPECT_EQ(Lexer("0x4B"sv).takeF64(), 0x4Bp0);

  EXPECT_EQ(Lexer("0x4B."sv).takeF32(), 0x4B.p0f);
  EXPECT_EQ(Lexer("0x4B."sv).takeF64(), 0x4B.p0);

  EXPECT_EQ(Lexer("0x4B.5"sv).takeF32(), 0x4B.5p0f);
  EXPECT_EQ(Lexer("0x4B.5"sv).takeF64(), 0x4B.5p0);

  EXPECT_EQ(Lexer("0x4Bp0"sv).takeF32(), 0x4Bp0f);
  EXPECT_EQ(Lexer("0x4Bp0"sv).takeF64(), 0x4Bp0);

  EXPECT_EQ(Lexer("0x4B.p1"sv).takeF32(), 0x4B.p1f);
  EXPECT_EQ(Lexer("0x4B.p1"sv).takeF64(), 0x4B.p1);

  EXPECT_EQ(Lexer("0x4BP1"sv).takeF32(), 0x4BP1f);
  EXPECT_EQ(Lexer("0x4BP1"sv).takeF64(), 0x4BP1);

  EXPECT_EQ(Lexer("0x4Bp+2"sv).takeF32(), 0x4Bp+2f);
  EXPECT_EQ(Lexer("0x4Bp+2"sv).takeF64(), 0x4Bp+2);

  EXPECT_EQ(Lexer("0x4B.P-02"sv).takeF32(), 0x4B.P-02f);
  EXPECT_EQ(Lexer("0x4B.P-02"sv).takeF64(), 0x4B.P-02);

  EXPECT_EQ(Lexer("0x4B.0p0"sv).takeF32(), 0x4B.0p0f);
  EXPECT_EQ(Lexer("0x4B.0p0"sv).takeF64(), 0x4B.0p0);

  EXPECT_EQ(Lexer("0x4B.0P1"sv).takeF32(), 0x4B.0P1f);
  EXPECT_EQ(Lexer("0x4B.0P1"sv).takeF64(), 0x4B.0P1);

  EXPECT_EQ(Lexer("0x4B.0p+2"sv).takeF32(), 0x4B.0p+2f);
  EXPECT_EQ(Lexer("0x4B.0p+2"sv).takeF64(), 0x4B.0p+2);

  EXPECT_EQ(Lexer("0x4B.0P-2"sv).takeF32(), 0x4B.0P-2f);
  EXPECT_EQ(Lexer("0x4B.0P-2"sv).takeF64(), 0x4B.0P-2);

  EXPECT_EQ(Lexer("+0x4B.0p+2"sv).takeF32(), +0x4B.0p+2f);
  EXPECT_EQ(Lexer("+0x4B.0p+2"sv).takeF64(), +0x4B.0p+2);

  EXPECT_EQ(Lexer("-0x4B.0p+2"sv).takeF32(), -0x4B.0p+2f);
  EXPECT_EQ(Lexer("-0x4B.0p+2"sv).takeF64(), -0x4B.0p+2);

  EXPECT_EQ(Lexer("0x4_2.0_0p+0_2"sv).takeF32(), 0x42.00p+02f);
  EXPECT_EQ(Lexer("0x4_2.0_0p+0_2"sv).takeF64(), 0x42.00p+02);

  EXPECT_FALSE(Lexer("0x4Bjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4Bjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.junk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.junk"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.0junk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.0junk"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.Pjunk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.Pjunk"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.p-junk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.p-junk"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.p-10junk"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.p-10junk"sv).takeF64());

  EXPECT_FALSE(Lexer("+0x"sv).takeF32());
  EXPECT_FALSE(Lexer("+0x"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4Bp"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4Bp"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4BpABC"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4BpABC"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4Bp0xABC"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4Bp0xABC"sv).takeF64());

  EXPECT_FALSE(Lexer("0x+0"sv).takeF32());
  EXPECT_FALSE(Lexer("0x+0"sv).takeF64());

  EXPECT_FALSE(Lexer("+-0x4B"sv).takeF32());
  EXPECT_FALSE(Lexer("+-0x4B"sv).takeF64());

  EXPECT_FALSE(Lexer("-+0x4B"sv).takeF32());
  EXPECT_FALSE(Lexer("-+0x4B"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4Bp+-0"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4Bp+-0"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4Bp-+0"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4Bp-+0"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.e+0"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.e+0"sv).takeF64());

  EXPECT_FALSE(Lexer("0x4B.E-0"sv).takeF32());
  EXPECT_FALSE(Lexer("0x4B.E-0"sv).takeF64());
}